

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O2

int32_t parse_frame(int64_t k)

{
  uint uVar1;
  Btor2Line *pBVar2;
  pointer pBVar3;
  int64_t iVar4;
  int32_t iVar5;
  uint uVar6;
  int64_t iVar7;
  size_t sVar8;
  Btor2Line *pBVar9;
  BtorSimArrayModel *pBVar10;
  BtorSimBitVector *pBVar11;
  BtorSimBitVector *pBVar12;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 b;
  int64_t iVar13;
  long lVar15;
  ulong extraout_RAX;
  char *pcVar16;
  ulong uVar17;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 this;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 unaff_RBX;
  long lVar18;
  Btor2Line *unaff_RBP;
  char *pcVar19;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 aVar20;
  char *pcVar21;
  char *pcVar22;
  size_t new_size;
  bool bVar23;
  BtorSimState BVar24;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 local_60;
  int32_t ch;
  BtorSimState tmp;
  ulong uVar14;
  
  if (0 < k) {
    transition(k);
  }
  msg(2,"parsing frame %ld",k);
  ch = next_char();
  if (ch == 0x23) {
    iVar7 = parse_unsigned_number(&ch);
    if ((iVar7 != k) || (ch != 10)) {
      pcVar22 = "missing \'#%ld\' state part header of frame %ld";
      iVar7 = k;
      goto LAB_00113696;
    }
    while (iVar7 = parse_assignment(), iVar4 = charno, -1 < iVar7) {
      charno = 1;
      lineno = lineno + -1;
      pBVar9 = unaff_RBP;
      iVar13 = iVar7;
      if ((long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 <= iVar7) goto LAB_001135ff;
      unaff_RBP = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7];
      if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_bitvec) {
        if (_ZL6symbol_1 == _ZL6symbol_0) {
          msg(4,"state assignment \'%ld %s\' at time frame %ld",iVar7,_ZL8constant_0,k);
        }
        else {
          msg(4,"state assignment \'%ld %s %s\' at time frame %ld",iVar7,_ZL8constant_0,_ZL6symbol_0
              ,k);
        }
        pcVar22 = _ZL8constant_0;
        sVar8 = strlen(_ZL8constant_0);
        if (sVar8 != (unaff_RBP->sort).field_3.bitvec.width) goto LAB_001135e3;
        bVar23 = false;
      }
      else {
        pcVar22 = _ZL11array_index_0;
        if (_ZL11array_index_1 == _ZL11array_index_0) {
          if (_ZL11array_index_1 == _ZL11array_index_2) {
            _ZL11array_index_1 = (char *)btorsim_realloc(_ZL11array_index_0,1);
            _ZL11array_index_2 = _ZL11array_index_1 + 1;
            _ZL11array_index_0 = _ZL11array_index_1;
          }
          pcVar19 = _ZL11array_index_2;
          pcVar22 = _ZL11array_index_0;
          pcVar16 = _ZL11array_index_1 + 1;
          pcVar21 = pcVar16;
          *_ZL11array_index_1 = '*';
          _ZL11array_index_1 = pcVar21;
          if (pcVar16 == pcVar19) {
            lVar18 = (long)pcVar19 - (long)pcVar22;
            new_size = ((long)pcVar19 - (long)pcVar22) * 2;
            if (lVar18 == 0) {
              new_size = 1;
            }
            pcVar22 = (char *)btorsim_realloc(pcVar22,new_size);
            pcVar16 = pcVar22 + lVar18;
            _ZL11array_index_2 = pcVar22 + new_size;
            _ZL11array_index_0 = pcVar22;
          }
          _ZL11array_index_1 = pcVar16 + 1;
          *pcVar16 = '\0';
        }
        if (_ZL6symbol_1 == _ZL6symbol_0) {
          pcVar19 = "state assignment \'%ld [%s] %s\' at time frame %ld";
          pcVar16 = (char *)k;
        }
        else {
          pcVar19 = "state assignment \'%ld [%s] %s %s\' at time frame %ld";
          pcVar16 = _ZL6symbol_0;
        }
        msg(4,pcVar19,iVar7,pcVar22,_ZL8constant_0,pcVar16);
        unaff_RBX.bv_state =
             (BtorSimBitVector *)
             btor2parser_get_line_by_id(model,(unaff_RBP->sort).field_3.array.index);
        pBVar9 = (Btor2Line *)
                 btor2parser_get_line_by_id(model,(unaff_RBP->sort).field_3.array.element);
        if ((long)_ZL11array_index_1 - (long)_ZL11array_index_0 == 2) {
          bVar23 = *_ZL11array_index_0 == '*';
        }
        else {
          bVar23 = false;
        }
        sVar8 = strlen(_ZL11array_index_0);
        pcVar22 = _ZL8constant_0;
        if (sVar8 != (((anon_union_16_2_9b82d22d_for_Btor2Sort_3 *)
                      &((unaff_RBX.array_state)->data)._M_h._M_element_count)->bitvec).width &&
            !bVar23) {
          charno = index_columno;
          iVar13 = (unaff_RBP->sort).field_3.array.index;
          pcVar22 = "expected index of width \'%u\'";
          goto LAB_00113609;
        }
        sVar8 = strlen(_ZL8constant_0);
        pBVar3 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (sVar8 != (pBVar9->sort).field_3.bitvec.width) {
          charno = constant_columno;
          iVar13 = (unaff_RBP->sort).field_3.array.element;
          pcVar22 = "expected element of width \'%u\'";
          goto LAB_00113609;
        }
        if (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
            super__Vector_impl_data._M_start[unaff_RBP->id].field_1.bv_state ==
            (BtorSimBitVector *)0x0) {
          pBVar10 = (BtorSimArrayModel *)operator_new(0x58);
          uVar1 = (pBVar9->sort).field_3.bitvec.width;
          pBVar10->index_width =
               (ulong)(((anon_union_16_2_9b82d22d_for_Btor2Sort_3 *)
                       &((unaff_RBX.array_state)->data)._M_h._M_element_count)->bitvec).width;
          pBVar10->element_width = (ulong)uVar1;
          pBVar10->random_seed = 0;
          pBVar10->const_init = (BtorSimBitVector *)0x0;
          (pBVar10->data)._M_h._M_buckets = &(pBVar10->data)._M_h._M_single_bucket;
          (pBVar10->data)._M_h._M_bucket_count = 1;
          (pBVar10->data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (pBVar10->data)._M_h._M_element_count = 0;
          (pBVar10->data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (pBVar10->data)._M_h._M_rehash_policy._M_next_resize = 0;
          (pBVar10->data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          pBVar3[unaff_RBP->id].field_1.array_state = pBVar10;
        }
      }
      if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_array && !bVar23) {
        local_60.bv_state = btorsim_bv_char_to_bv(_ZL11array_index_0);
        pcVar22 = _ZL8constant_0;
      }
      else {
        local_60.bv_state = (BtorSimBitVector *)0x0;
      }
      pBVar11 = btorsim_bv_char_to_bv(pcVar22);
      if (k == 0) {
        unaff_RBX = (anon_union_8_2_8be7de1a_for_BtorSimState_2)
                    ((anon_union_8_2_8be7de1a_for_BtorSimState_2 *)
                    (inits.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                     super__Vector_impl_data._M_start + unaff_RBP->id))->bv_state;
        if (((Btor2Line *)unaff_RBX.bv_state != (Btor2Line *)0x0) &&
           (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_start[unaff_RBP->id] != (Btor2Line *)0x0)) {
          pcVar22 = "init & next for state %ld";
          msg(4,"init & next for state %ld");
          BVar24 = simulate(*(int64_t *)((long)unaff_RBX.bv_state[0xe] + 8));
          this = BVar24.field_1;
          tmp.type = BVar24.type;
          tmp.field_1 = this;
          if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_bitvec) {
            iVar5 = btorsim_bv_compare(pBVar11,this.bv_state);
            if (iVar5 != 0) goto LAB_00113679;
          }
          else {
            if (bVar23) {
              b.bv_state = btorsim_bv_copy(this.bv_state);
              this = (anon_union_8_2_8be7de1a_for_BtorSimState_2)pcVar22;
            }
            else {
              aVar20 = local_60;
              b.bv_state = BtorSimArrayModel::check(this.array_state,local_60.bv_state);
              this = aVar20;
            }
            if ((Btor2Line *)b.bv_state != (Btor2Line *)0x0) {
              this = b;
              iVar5 = btorsim_bv_compare(pBVar11,b.bv_state);
              if (iVar5 != 0) goto LAB_00113679;
              btorsim_bv_free(b.bv_state);
            }
          }
          BtorSimState::remove(&tmp,(char *)this.bv_state);
        }
      }
      lineno = lineno + 1;
      charno = iVar4;
      if ((0 < k) &&
         (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
          super__Vector_impl_data._M_start[unaff_RBP->id] != (Btor2Line *)0x0)) {
        pBVar10 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                  _M_impl.super__Vector_impl_data._M_start[unaff_RBP->id].field_1.array_state;
        if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_bitvec) {
          iVar5 = btorsim_bv_compare(pBVar11,(BtorSimBitVector *)pBVar10);
          if (iVar5 != 0) {
LAB_0011365f:
            unaff_RBX.bv_state = (BtorSimBitVector *)unaff_RBP->id;
            pcVar22 = "incompatible assignment for state %ld id %ld in time frame %ld";
            goto LAB_0011366d;
          }
        }
        else {
          if (bVar23) {
            pBVar12 = BtorSimArrayModel::get_const_init(pBVar10);
          }
          else {
            pBVar12 = BtorSimArrayModel::check(pBVar10,local_60.bv_state);
          }
          if (pBVar12 != (BtorSimBitVector *)0x0) {
            iVar5 = btorsim_bv_compare(pBVar11,pBVar12);
            if (iVar5 != 0) goto LAB_0011365f;
            btorsim_bv_free(pBVar12);
          }
        }
      }
      if ((unaff_RBP->sort).tag == BTOR2_TAG_SORT_bitvec) {
        update_current_state(unaff_RBP->id,pBVar11);
      }
      else {
        tmp.field_1.bv_state = (BtorSimBitVector *)0x0;
        tmp.type = ARRAY;
        if (bVar23) {
          tmp.field_1.array_state =
               BtorSimArrayModel::set_const_init
                         (current_state.
                          super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                          super__Vector_impl_data._M_start[unaff_RBP->id].field_1.array_state,
                          pBVar11);
          local_60 = unaff_RBX;
        }
        else {
          tmp.field_1 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)
                        BtorSimArrayModel::write
                                  (current_state.
                                   super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                                   _M_impl.super__Vector_impl_data._M_start[unaff_RBP->id].field_1.
                                   array_state,local_60._0_4_,pBVar11,
                                   (size_t)current_state.
                                           super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
          btorsim_bv_free(local_60.bv_state);
        }
        update_current_state(unaff_RBP->id,&tmp);
        btorsim_bv_free(pBVar11);
        unaff_RBX = local_60;
      }
    }
  }
  else {
    prev_char(ch);
  }
  tmp.type = next_char();
  pBVar9 = unaff_RBP;
  if (((tmp.type != 0x40) || (iVar7 = parse_unsigned_number((int32_t *)&tmp), iVar7 != k)) ||
     (tmp.type != 10)) {
    parse_assignment();
  }
  while( true ) {
    iVar13 = parse_assignment();
    iVar7 = charno;
    if (iVar13 < 0) {
      if (k == 0) {
        initialize_states(0);
      }
      initialize_inputs(k,0);
      simulate_step(k,0);
      return found_end_of_witness ^ 1;
    }
    charno = 1;
    lineno = lineno + -1;
    if ((long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 <= iVar13) break;
    pcVar22 = (char *)k;
    if (_ZL11array_index_1 == _ZL11array_index_0) {
      if (_ZL6symbol_1 != _ZL6symbol_0) {
        pcVar21 = "input assignment \'%ld %s %s\' at time frame %ld";
        pcVar16 = _ZL8constant_0;
        pcVar19 = _ZL6symbol_0;
        goto LAB_001134a1;
      }
      msg(4,"input assignment \'%ld %s\' at time frame %ld",iVar13,_ZL8constant_0,k);
    }
    else {
      pcVar16 = _ZL11array_index_0;
      pcVar19 = _ZL8constant_0;
      if (_ZL6symbol_1 == _ZL6symbol_0) {
        pcVar21 = "input assignment \'%ld [%s] %s\' at time frame %ld";
      }
      else {
        pcVar21 = "input assignment \'%ld [%s] %s %s\' at time frame %ld";
        pcVar22 = _ZL6symbol_0;
      }
LAB_001134a1:
      msg(4,pcVar21,iVar13,pcVar16,pcVar19,pcVar22);
    }
    pcVar22 = _ZL8constant_0;
    unaff_RBP = (Btor2Line *)
                current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                _M_impl.super__Vector_impl_data._M_start;
    pBVar2 = inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar13];
    unaff_RBX.bv_state = (BtorSimBitVector *)pBVar2->id;
    pBVar9 = unaff_RBP;
    if (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
        super__Vector_impl_data._M_start[(long)unaff_RBX].type == BITVEC) {
      sVar8 = strlen(_ZL8constant_0);
      if (sVar8 != (pBVar2->sort).field_3.bitvec.width) goto LAB_001135e3;
      if ((((pointer)((long)unaff_RBP + unaff_RBX * 0x10))->field_1).bv_state !=
          (BtorSimBitVector *)0x0) goto LAB_00113610;
      pBVar11 = btorsim_bv_char_to_bv(pcVar22);
      lineno = lineno + 1;
      charno = iVar7;
      update_current_state(pBVar2->id,pBVar11);
    }
    else {
      pBVar11 = btorsim_bv_char_to_bv(_ZL11array_index_0);
      pBVar12 = btorsim_bv_char_to_bv(_ZL8constant_0);
      lineno = lineno + 1;
      charno = iVar7;
      pBVar10 = (BtorSimArrayModel *)
                BtorSimArrayModel::write
                          (current_state.
                           super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                           super__Vector_impl_data._M_start[pBVar2->id].field_1.array_state,
                           (int)pBVar11,pBVar12,pBVar2->id * 0x10);
      update_current_state(pBVar2->id,pBVar10);
    }
  }
  pcVar22 = "less than %ld defined";
  iVar7 = iVar13;
  goto LAB_00113609;
LAB_001135e3:
  charno = constant_columno;
  parse_error("expected constant of width \'%u\'");
  pBVar9 = unaff_RBP;
LAB_001135ff:
  pcVar22 = "less than %ld states defined";
  iVar7 = iVar13;
LAB_00113609:
  parse_error(pcVar22,iVar13);
  unaff_RBP = pBVar9;
  iVar13 = iVar7;
LAB_00113610:
  pcVar22 = "input %ld id %ld assigned twice in frame %ld";
LAB_0011366d:
  parse_error(pcVar22,iVar13,unaff_RBX.bv_state,k);
  iVar7 = iVar13;
LAB_00113679:
  k = unaff_RBP->id;
  pcVar22 = "incompatible initialized state %ld id %ld";
LAB_00113696:
  parse_error(pcVar22,iVar7,k);
  iVar5 = next_char();
  if (iVar5 == 0x30) {
    uVar6 = next_char();
    uVar14 = (ulong)uVar6;
    if (uVar6 - 0x30 < 10) {
      do {
        parse_error("unexpected digit \'%c\' after \'0\'",uVar14 & 0xffffffff);
LAB_0011373f:
        pcVar22 = "expected digit";
LAB_00113728:
        parse_error(pcVar22);
        uVar14 = extraout_RAX;
      } while( true );
    }
    uVar14 = 0;
  }
  else {
    if (9 < iVar5 - 0x30U) goto LAB_0011373f;
    uVar14 = (ulong)(iVar5 - 0x30U);
    while( true ) {
      uVar6 = next_char();
      uVar1 = uVar6 - 0x30;
      if (9 < uVar1) break;
      if (0xccccccccccccccc < (long)uVar14) {
        pcVar22 = "number too large (too many digits)";
        goto LAB_00113728;
      }
      lVar15 = uVar14 * 10;
      uVar17 = (ulong)uVar1 ^ 0x7fffffffffffffff;
      lVar18 = uVar14 * -10;
      uVar14 = lVar15 + (ulong)uVar1;
      if (SBORROW8(uVar17,lVar15) != (long)(uVar17 + lVar18) < 0) {
        pcVar22 = "number too large";
        goto LAB_00113728;
      }
    }
  }
  *(uint *)pcVar22 = uVar6;
  return (int32_t)uVar14;
}

Assistant:

static int32_t
parse_frame (int64_t k)
{
  if (k > 0) transition (k);
  msg (2, "parsing frame %" PRId64, k);
  parse_state_part (k);
  parse_input_part (k);
  const int32_t randomize = 0;
  if (!k) initialize_states (randomize);
  initialize_inputs (k, randomize);
  simulate_step (k, randomize);
  return !found_end_of_witness;
}